

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

void __thiscall Minisat::Solver::cancelUntil(Solver *this,int bLevel,bool allow_trail_saving)

{
  uint uVar1;
  uint64_t uVar2;
  bool bVar3;
  int iVar4;
  CRef CVar5;
  int *piVar6;
  Lit *pLVar7;
  uint *puVar8;
  double *pdVar9;
  lbool *tbs;
  byte *pbVar10;
  Lit *pLVar11;
  byte in_DL;
  undefined1 extraout_DL;
  undefined7 extraout_var;
  int in_ESI;
  uchar *sig;
  Solver *in_RDI;
  size_t in_R8;
  double dVar12;
  double dVar13;
  Lit l;
  int j;
  int i;
  int nLitId;
  double old_activity;
  double adjusted_reward;
  uint32_t age;
  Var x;
  int c;
  bool savetrail;
  Lit *in_stack_ffffffffffffff48;
  Solver *in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff5c;
  Solver *in_stack_ffffffffffffff60;
  vec<Minisat::Lit> *this_00;
  bool local_51;
  int local_44;
  int local_40;
  int local_3c;
  lbool local_31;
  double local_30;
  double local_28;
  uint local_20;
  int local_1c;
  int local_18;
  uint local_14;
  bool local_e;
  byte local_d;
  int local_c;
  
  local_d = in_DL & 1;
  local_c = in_ESI;
  iVar4 = decisionLevel((Solver *)0x1314e3);
  if (local_c < iVar4) {
    reset_old_trail(in_stack_ffffffffffffff60);
    local_51 = false;
    if (((local_d & 1) != 0) && (local_51 = false, (in_RDI->use_backuped_trail & 1U) != 0)) {
      iVar4 = decisionLevel((Solver *)0x131528);
      local_51 = 1 < iVar4 - local_c;
    }
    local_e = local_51;
    vec<Minisat::Lit>::clear
              ((vec<Minisat::Lit> *)in_stack_ffffffffffffff50,
               SUB81((ulong)in_stack_ffffffffffffff48 >> 0x38,0));
    local_14 = vec<Minisat::Lit>::size(&in_RDI->trail);
    while( true ) {
      local_14 = local_14 - 1;
      uVar1 = local_14;
      piVar6 = vec<int>::operator[](&in_RDI->trail_lim,local_c);
      if ((int)uVar1 < *piVar6) break;
      pLVar7 = vec<Minisat::Lit>::operator[](&in_RDI->trail,local_14);
      local_1c = pLVar7->x;
      local_18 = var((Lit)local_1c);
      iVar4 = level(in_stack_ffffffffffffff50,(Var)((ulong)in_stack_ffffffffffffff48 >> 0x20));
      if (local_c < iVar4) {
        if ((local_e & 1U) != 0) {
          pLVar7 = vec<Minisat::Lit>::operator[](&in_RDI->trail,local_14);
          vec<Minisat::Lit>::push_(&in_RDI->old_trail,pLVar7);
          CVar5 = reason(in_stack_ffffffffffffff50,(Var)((ulong)in_stack_ffffffffffffff48 >> 0x20));
          puVar8 = vec<unsigned_int>::operator[](&in_RDI->oldreasons,local_18);
          *puVar8 = CVar5;
        }
        bVar3 = usesVSIDS(in_RDI);
        if (!bVar3) {
          uVar2 = in_RDI->conflicts;
          puVar8 = vec<unsigned_int>::operator[](&in_RDI->picked,local_18);
          local_20 = (int)uVar2 - *puVar8;
          if (local_20 != 0) {
            puVar8 = vec<unsigned_int>::operator[](&in_RDI->conflicted,local_18);
            uVar1 = *puVar8;
            puVar8 = vec<unsigned_int>::operator[](&in_RDI->almost_conflicted,local_18);
            local_28 = (double)(uVar1 + *puVar8) / (double)local_20;
            pdVar9 = vec<double>::operator[](&in_RDI->activity_CHB,local_18);
            local_30 = *pdVar9;
            dVar13 = (1.0 - in_RDI->step_size) * local_30;
            dVar12 = in_RDI->step_size * local_28;
            pdVar9 = vec<double>::operator[](&in_RDI->activity_CHB,local_18);
            *pdVar9 = dVar12 + dVar13;
            bVar3 = usesCHB(in_RDI);
            if ((bVar3) &&
               (bVar3 = Heap<Minisat::Solver::VarOrderLt>::inHeap
                                  ((Heap<Minisat::Solver::VarOrderLt> *)in_stack_ffffffffffffff60,
                                   in_stack_ffffffffffffff5c), bVar3)) {
              pdVar9 = vec<double>::operator[](&in_RDI->activity_CHB,local_18);
              iVar4 = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
              if (*pdVar9 <= local_30) {
                Heap<Minisat::Solver::VarOrderLt>::increase
                          ((Heap<Minisat::Solver::VarOrderLt> *)in_stack_ffffffffffffff50,iVar4);
              }
              else {
                Heap<Minisat::Solver::VarOrderLt>::decrease
                          ((Heap<Minisat::Solver::VarOrderLt> *)in_stack_ffffffffffffff50,iVar4);
              }
            }
          }
        }
        uVar2 = in_RDI->conflicts;
        puVar8 = vec<unsigned_int>::operator[](&in_RDI->canceled,local_18);
        *puVar8 = (uint)uVar2;
        lbool::lbool(&local_31,'\x02');
        tbs = vec<Minisat::lbool>::operator[](&in_RDI->assigns,local_18);
        uVar1 = local_14;
        tbs->value = local_31.value;
        if ((1 < in_RDI->phase_saving) ||
           ((in_RDI->phase_saving == 1 &&
            (tbs = (lbool *)vec<int>::last(&in_RDI->trail_lim), *(int *)tbs < (int)uVar1)))) {
          sig = (uchar *)(ulong)local_14;
          pLVar7 = vec<Minisat::Lit>::operator[](&in_RDI->trail,local_14);
          iVar4 = sign((EVP_PKEY_CTX *)(ulong)(uint)pLVar7->x,sig,
                       (size_t *)CONCAT71(extraout_var,extraout_DL),&tbs->value,in_R8);
          pbVar10 = (byte *)vec<char>::operator[](&in_RDI->polarity,local_18);
          *pbVar10 = (byte)iVar4 & 1;
        }
        insertVarOrder(in_stack_ffffffffffffff50,(Var)((ulong)in_stack_ffffffffffffff48 >> 0x20));
      }
      else {
        vec<Minisat::Lit>::operator[](&in_RDI->trail,local_14);
        vec<Minisat::Lit>::push
                  ((vec<Minisat::Lit> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      }
    }
    piVar6 = vec<int>::operator[](&in_RDI->trail_lim,local_c);
    in_RDI->qhead = *piVar6;
    this_00 = &in_RDI->trail;
    iVar4 = vec<Minisat::Lit>::size(&in_RDI->trail);
    piVar6 = vec<int>::operator[](&in_RDI->trail_lim,local_c);
    vec<Minisat::Lit>::shrink(this_00,iVar4 - *piVar6);
    iVar4 = vec<int>::size(&in_RDI->trail_lim);
    vec<int>::shrink(&in_RDI->trail_lim,iVar4 - local_c);
    local_3c = vec<Minisat::Lit>::size(&in_RDI->add_tmp);
    while (local_3c = local_3c + -1, -1 < local_3c) {
      in_stack_ffffffffffffff50 = (Solver *)&in_RDI->trail;
      pLVar7 = vec<Minisat::Lit>::operator[](&in_RDI->add_tmp,local_3c);
      vec<Minisat::Lit>::push_((vec<Minisat::Lit> *)in_stack_ffffffffffffff50,pLVar7);
    }
    vec<Minisat::Lit>::clear
              ((vec<Minisat::Lit> *)in_stack_ffffffffffffff50,
               SUB81((ulong)in_stack_ffffffffffffff48 >> 0x38,0));
    if ((local_e & 1U) != 0) {
      local_40 = 0;
      local_44 = vec<Minisat::Lit>::size(&in_RDI->old_trail);
      while (local_44 = local_44 + -1, local_40 < local_44) {
        pLVar7 = vec<Minisat::Lit>::operator[](&in_RDI->old_trail,local_40);
        iVar4 = pLVar7->x;
        pLVar7 = vec<Minisat::Lit>::operator[](&in_RDI->old_trail,local_44);
        pLVar11 = vec<Minisat::Lit>::operator[](&in_RDI->old_trail,local_40);
        pLVar11->x = pLVar7->x;
        pLVar7 = vec<Minisat::Lit>::operator[](&in_RDI->old_trail,local_44);
        pLVar7->x = iVar4;
        local_40 = local_40 + 1;
      }
      iVar4 = vec<Minisat::Lit>::size(&in_RDI->old_trail);
      in_RDI->backuped_trail_lits = (long)iVar4 + in_RDI->backuped_trail_lits;
    }
  }
  return;
}

Assistant:

void Solver::cancelUntil(int bLevel, bool allow_trail_saving)
{

    if (decisionLevel() > bLevel) {
        TRACE(std::cout << "c backtrack to " << bLevel << std::endl);

        reset_old_trail();

        bool savetrail = allow_trail_saving && use_backuped_trail && (decisionLevel() - bLevel > 1);

        add_tmp.clear();
        for (int c = trail.size() - 1; c >= trail_lim[bLevel]; c--) {
            Var x = var(trail[c]);

            if (level(x) <= bLevel) {
                add_tmp.push(trail[c]);
                continue;
            }
            if (savetrail) {
                old_trail.push_(trail[c]); /* we traverse trail in reverse order */
                oldreasons[x] = reason(x);
            }

            if (!usesVSIDS()) {
                uint32_t age = conflicts - picked[x];
                if (age > 0) {
                    double adjusted_reward = ((double)(conflicted[x] + almost_conflicted[x])) / ((double)age);
                    double old_activity = activity_CHB[x];
                    activity_CHB[x] = step_size * adjusted_reward + ((1 - step_size) * old_activity);
                    if (usesCHB() && order_heap->inHeap(x)) {
                        if (activity_CHB[x] > old_activity)
                            order_heap->decrease(x);
                        else
                            order_heap->increase(x);
                    }
                }
            }
#ifdef ANTI_EXPLORATION
            canceled[x] = conflicts;
#endif

            assigns[x] = l_Undef;
#ifdef PRINT_OUT
            std::cout << "undo " << x << "\n";
#endif
            if (phase_saving > 1 || ((phase_saving == 1) && c > trail_lim.last())) polarity[x] = sign(trail[c]);
            insertVarOrder(x);
        }
        qhead = trail_lim[bLevel];
        trail.shrink(trail.size() - trail_lim[bLevel]);
        trail_lim.shrink(trail_lim.size() - bLevel);
        for (int nLitId = add_tmp.size() - 1; nLitId >= 0; --nLitId) {
            trail.push_(add_tmp[nLitId]);
        }

        add_tmp.clear();

        /* reverse saved trail, as we added elements in reverse order as well */
        if (savetrail) {
            int i = 0, j = old_trail.size() - 1;
            while (i < j) {
                const Lit l = old_trail[i];
                old_trail[i++] = old_trail[j];
                old_trail[j--] = l;
            }
            backuped_trail_lits += old_trail.size();
        }
    }
}